

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.cpp
# Opt level: O2

unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true> __thiscall
duckdb::CatalogSetSecretStorage::StoreSecret
          (CatalogSetSecretStorage *this,
          unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
          *secret,OnCreateConflict on_conflict,
          optional_ptr<duckdb::CatalogTransaction,_true> transaction)

{
  byte bVar1;
  char cVar2;
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  CatalogTransaction transaction_02;
  CatalogTransaction transaction_03;
  _Head_base<0UL,_duckdb::SecretEntry_*,_false> _Var3;
  pointer pCVar4;
  pointer pBVar5;
  optional_ptr<duckdb::CatalogEntry,_true> oVar6;
  type pBVar7;
  Catalog *args_1;
  pointer pSVar8;
  pointer pSVar9;
  CatalogEntry *pCVar10;
  type args;
  InternalException *this_00;
  InvalidInputException *this_01;
  undefined7 in_register_00000011;
  unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true> *puVar11
  ;
  char *pcVar12;
  optional_ptr<duckdb::CatalogTransaction,_true> in_R8;
  _Head_base<0UL,_duckdb::SecretCatalogEntry_*,_false> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  _Head_base<0UL,_duckdb::SecretEntry_*,_false> local_1a8;
  unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
  *local_1a0;
  optional_ptr<duckdb::CatalogTransaction,_true> local_198;
  string secret_name;
  optional_ptr<duckdb::CatalogEntry,_true> local_170;
  LogicalDependencyList l;
  CatalogTransaction local_130;
  CatalogTransaction local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  CatalogTransaction local_80;
  CatalogTransaction local_58;
  
  puVar11 = (unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
             *)CONCAT71(in_register_00000011,on_conflict);
  local_1a0 = secret + 7;
  local_1a8._M_head_impl = (SecretEntry *)this;
  pCVar4 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::operator->
                     ((unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>
                       *)local_1a0);
  local_198.ptr = in_R8.ptr;
  GetTransactionOrDefault(&local_58,(CatalogSetSecretStorage *)secret,in_R8);
  pBVar5 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
           ::operator->(puVar11);
  transaction_00.context.ptr = local_58.context.ptr;
  transaction_00.db.ptr = local_58.db.ptr;
  transaction_00.transaction.ptr = local_58.transaction.ptr;
  transaction_00.transaction_id = local_58.transaction_id;
  transaction_00.start_time = local_58.start_time;
  oVar6 = CatalogSet::GetEntry(pCVar4,transaction_00,&pBVar5->name);
  if (oVar6.ptr != (CatalogEntry *)0x0) {
    switch((ulong)transaction.ptr & 0xff) {
    case 0:
      pcVar12 = "Temporary";
      if (*(char *)&secret[6].
                    super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                    .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl != '\0')
      {
        pcVar12 = "Persistent";
      }
      ::std::__cxx11::string::string((string *)&l,pcVar12,(allocator *)&secret_name);
      if (*(char *)&secret[6].
                    super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                    .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl == '\x01'
         ) {
        ::std::operator+(&local_1c8," in secret storage \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (secret + 1));
        ::std::operator+(&secret_name,&local_1c8,"\'");
        ::std::__cxx11::string::~string((string *)&local_1c8);
      }
      else {
        ::std::__cxx11::string::string
                  ((string *)&secret_name,anon_var_dwarf_4b71df5 + 9,(allocator *)&local_1c8);
      }
      this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_1c8,"%s secret with name \'%s\' already exists%s!",
                 (allocator *)&local_170);
      ::std::__cxx11::string::string((string *)&local_a0,(string *)&l);
      pBVar5 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
               ::operator->(puVar11);
      ::std::__cxx11::string::string((string *)&local_c0,(string *)&pBVar5->name);
      ::std::__cxx11::string::string((string *)&local_e0,(string *)&secret_name);
      InvalidInputException::
      InvalidInputException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (this_01,&local_1c8,&local_a0,&local_c0,&local_e0);
      __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    case 1:
      *(undefined8 *)local_1a8._M_head_impl = 0;
      return (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>)
             local_1a8._M_head_impl;
    case 2:
      pCVar4 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::
               operator->((unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>
                           *)local_1a0);
      GetTransactionOrDefault(&local_80,(CatalogSetSecretStorage *)secret,local_198);
      pBVar5 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
               ::operator->(puVar11);
      transaction_01.context.ptr = local_80.context.ptr;
      transaction_01.db.ptr = local_80.db.ptr;
      transaction_01.transaction.ptr = local_80.transaction.ptr;
      transaction_01.transaction_id = local_80.transaction_id;
      transaction_01.start_time = local_80.start_time;
      CatalogSet::DropEntry(pCVar4,transaction_01,&pBVar5->name,true,true);
      break;
    case 3:
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&l,"unknown OnCreateConflict found while registering secret",
                 (allocator *)&secret_name);
      InternalException::InternalException(this_00,(string *)&l);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  pBVar7 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
           ::operator*(puVar11);
  (*(code *)(((secret->
              super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
              )._M_t.
              super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
              ._M_t.
              super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
              .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl)->provider).
            field_2._M_allocated_capacity)(secret,pBVar7,(ulong)transaction.ptr & 0xff);
  pBVar5 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
           ::operator->(puVar11);
  ::std::__cxx11::string::string((string *)&secret_name,(string *)&pBVar5->name);
  args_1 = Catalog::GetSystemCatalog
                     ((DatabaseInstance *)
                      secret[8].
                      super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                      ._M_t.
                      super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                      .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl);
  make_uniq<duckdb::SecretCatalogEntry,duckdb::unique_ptr<duckdb::BaseSecret_const,std::default_delete<duckdb::BaseSecret_const>,true>,duckdb::Catalog&>
            ((duckdb *)&local_1c8,puVar11,args_1);
  bVar1 = *(byte *)&secret[6].
                    super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                    .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl;
  pSVar8 = unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
           ::operator->((unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
                         *)&local_1c8);
  puVar11 = local_1a0;
  (pSVar8->super_InCatalogEntry).super_CatalogEntry.temporary = (bool)(bVar1 ^ 1);
  pSVar8 = unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
           ::operator->((unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
                         *)&local_1c8);
  pSVar9 = unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>::
           operator->(&pSVar8->secret);
  ::std::__cxx11::string::_M_assign((string *)&pSVar9->storage_mode);
  cVar2 = *(char *)&secret[6].
                    super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                    .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl;
  pSVar8 = unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
           ::operator->((unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
                         *)&local_1c8);
  pSVar9 = unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>::
           operator->(&pSVar8->secret);
  pSVar9->persist_type = cVar2 + TEMPORARY;
  l.set._M_h._M_buckets = &l.set._M_h._M_single_bucket;
  l.set._M_h._M_bucket_count = 1;
  l.set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  l.set._M_h._M_element_count = 0;
  l.set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  l.set._M_h._M_rehash_policy._M_next_resize = 0;
  l.set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pCVar4 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::operator->
                     ((unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>
                       *)puVar11);
  GetTransactionOrDefault(&local_108,(CatalogSetSecretStorage *)secret,local_198);
  local_1d0._M_head_impl = (SecretCatalogEntry *)local_1c8._M_dataplus._M_p;
  local_1c8._M_dataplus._M_p = (pointer)0x0;
  transaction_02.context.ptr = local_108.context.ptr;
  transaction_02.db.ptr = local_108.db.ptr;
  transaction_02.transaction.ptr = local_108.transaction.ptr;
  transaction_02.transaction_id = local_108.transaction_id;
  transaction_02.start_time = local_108.start_time;
  CatalogSet::CreateEntry
            (pCVar4,transaction_02,&secret_name,
             (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *)
             &local_1d0,&l);
  if (local_1d0._M_head_impl != (SecretCatalogEntry *)0x0) {
    (*((local_1d0._M_head_impl)->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  local_1d0._M_head_impl = (SecretCatalogEntry *)0x0;
  pCVar4 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::operator->
                     ((unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>
                       *)puVar11);
  GetTransactionOrDefault(&local_130,(CatalogSetSecretStorage *)secret,local_198);
  transaction_03.context.ptr = local_130.context.ptr;
  transaction_03.db.ptr = local_130.db.ptr;
  transaction_03.transaction.ptr = local_130.transaction.ptr;
  transaction_03.transaction_id = local_130.transaction_id;
  transaction_03.start_time = local_130.start_time;
  local_170 = CatalogSet::GetEntry(pCVar4,transaction_03,&secret_name);
  pCVar10 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&local_170);
  args = unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>::operator*
                   ((unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>
                     *)&pCVar10[1].oid);
  _Var3._M_head_impl = local_1a8._M_head_impl;
  make_uniq<duckdb::SecretEntry,duckdb::SecretEntry&>((duckdb *)local_1a8._M_head_impl,args);
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&l);
  if ((long *)local_1c8._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_1c8._M_dataplus._M_p + 8))();
  }
  ::std::__cxx11::string::~string((string *)&secret_name);
  return (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
         (__uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
         _Var3._M_head_impl;
}

Assistant:

unique_ptr<SecretEntry> CatalogSetSecretStorage::StoreSecret(unique_ptr<const BaseSecret> secret,
                                                             OnCreateConflict on_conflict,
                                                             optional_ptr<CatalogTransaction> transaction) {
	if (secrets->GetEntry(GetTransactionOrDefault(transaction), secret->GetName())) {
		if (on_conflict == OnCreateConflict::ERROR_ON_CONFLICT) {
			string persist_string = persistent ? "Persistent" : "Temporary";
			string storage_string = persistent ? " in secret storage '" + storage_name + "'" : "";
			throw InvalidInputException("%s secret with name '%s' already exists%s!", persist_string, secret->GetName(),
			                            storage_string);
		} else if (on_conflict == OnCreateConflict::IGNORE_ON_CONFLICT) {
			return nullptr;
		} else if (on_conflict == OnCreateConflict::ALTER_ON_CONFLICT) {
			throw InternalException("unknown OnCreateConflict found while registering secret");
		} else if (on_conflict == OnCreateConflict::REPLACE_ON_CONFLICT) {
			secrets->DropEntry(GetTransactionOrDefault(transaction), secret->GetName(), true, true);
		}
	}

	// Call write function
	WriteSecret(*secret, on_conflict);

	auto secret_name = secret->GetName();
	auto secret_entry = make_uniq<SecretCatalogEntry>(std::move(secret), Catalog::GetSystemCatalog(db));
	secret_entry->temporary = !persistent;
	secret_entry->secret->storage_mode = storage_name;
	secret_entry->secret->persist_type = persistent ? SecretPersistType::PERSISTENT : SecretPersistType::TEMPORARY;
	LogicalDependencyList l;
	secrets->CreateEntry(GetTransactionOrDefault(transaction), secret_name, std::move(secret_entry), l);

	auto secret_catalog_entry =
	    &secrets->GetEntry(GetTransactionOrDefault(transaction), secret_name)->Cast<SecretCatalogEntry>();
	return make_uniq<SecretEntry>(*secret_catalog_entry->secret);
}